

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O1

void __thiscall
boost::filesystem::directory_iterator::directory_iterator(directory_iterator *this,path *p)

{
  dir_itr_imp *p_00;
  
  p_00 = (dir_itr_imp *)operator_new(0x40);
  (p_00->dir_entry).m_path.m_pathname._M_dataplus._M_p =
       (pointer)&(p_00->dir_entry).m_path.m_pathname.field_2;
  (p_00->dir_entry).m_path.m_pathname._M_string_length = 0;
  (p_00->dir_entry).m_path.m_pathname.field_2._M_local_buf[0] = '\0';
  (p_00->dir_entry).m_status.m_value = status_error;
  (p_00->dir_entry).m_status.m_perms = perms_not_known;
  (p_00->dir_entry).m_symlink_status.m_value = status_error;
  (p_00->dir_entry).m_symlink_status.m_perms = perms_not_known;
  p_00->handle = (void *)0x0;
  p_00->buffer = (void *)0x0;
  shared_ptr<boost::filesystem::detail::dir_itr_imp>::
  shared_ptr<boost::filesystem::detail::dir_itr_imp>(&this->m_imp,p_00);
  detail::directory_iterator_construct(this,p,(error_code *)0x0);
  return;
}

Assistant:

explicit directory_iterator(const path& p)
        : m_imp(new detail::dir_itr_imp)
          { detail::directory_iterator_construct(*this, p, 0); }